

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetQueue.h
# Opt level: O2

void __thiscall
dg::ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::BasicBlock_*>_>::push
          (SetQueue<dg::ADT::QueueFIFO<const_llvm::BasicBlock_*>_> *this,ValueType *what)

{
  pair<std::_Rb_tree_iterator<const_llvm::BasicBlock_*>,_bool> pVar1;
  
  pVar1 = std::
          _Rb_tree<llvm::BasicBlock_const*,llvm::BasicBlock_const*,std::_Identity<llvm::BasicBlock_const*>,std::less<llvm::BasicBlock_const*>,std::allocator<llvm::BasicBlock_const*>>
          ::_M_insert_unique<llvm::BasicBlock_const*const&>
                    ((_Rb_tree<llvm::BasicBlock_const*,llvm::BasicBlock_const*,std::_Identity<llvm::BasicBlock_const*>,std::less<llvm::BasicBlock_const*>,std::allocator<llvm::BasicBlock_const*>>
                      *)this,what);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::deque<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>::push_back
              ((deque<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_> *)
               &this->_queue,what);
    return;
  }
  return;
}

Assistant:

void push(const ValueType &what) {
        if (_queued.insert(what).second)
            _queue.push(what);
    }